

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

JavascriptString * __thiscall
Js::DateImplementation::GetString
          (DateImplementation *this,DateStringFormat dsf,ScriptContext *requestContext,
          DateTimeFlag noDateTime)

{
  uint uVar1;
  bool bVar2;
  JavascriptString *pJVar3;
  Type tv;
  
  bVar2 = NumberUtilities::IsNan(this->m_tvUtc);
  if (bVar2) {
    pJVar3 = StringCache::GetInvalidDate
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    return pJVar3;
  }
  uVar1 = this->m_grfval;
  if (dsf._value == '\x02') {
    if ((uVar1 & 4) == 0) {
      DateUtilities::GetYmdFromTv(this->m_tvUtc,&this->m_ymdUtc);
      *(byte *)&this->m_grfval = (byte)this->m_grfval | 4;
    }
    pJVar3 = GetDateGmtString(&this->m_ymdUtc,requestContext);
    return pJVar3;
  }
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 1) == 0) {
      tv = GetTvLcl<Js::ScriptContext>(this->m_tvUtc,requestContext,&this->m_tzd);
      this->m_tvLcl = tv;
      *(byte *)&this->m_grfval = (byte)this->m_grfval | 1;
    }
    else {
      tv = this->m_tvLcl;
    }
    DateUtilities::GetYmdFromTv(tv,&this->m_ymdLcl);
    *(byte *)&this->m_grfval = (byte)this->m_grfval | 2;
  }
  pJVar3 = GetDateDefaultString(&this->m_ymdLcl,&this->m_tzd,noDateTime,requestContext);
  return pJVar3;
}

Assistant:

JavascriptString*
    DateImplementation::GetString(DateStringFormat dsf,
        ScriptContext* requestContext, DateTimeFlag noDateTime)
    {
        if (JavascriptNumber::IsNan(m_tvUtc))
        {
            return requestContext->GetLibrary()->GetInvalidDateString();
        }

        switch (dsf)
         {
            default:
                EnsureYmdLcl(requestContext);
                return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);

#ifdef ENABLE_GLOBALIZATION
            case DateStringFormat::Locale:
                EnsureYmdLcl(requestContext);

                if( m_ymdLcl.year > 1600 && m_ymdLcl.year < 10000 )
                {
                    // The year falls in the range which can be handled by both the Win32
                    // function GetDateFormat and the COM+ date type
                    // - the latter is for forward compatibility with JS 7.
                    JavascriptString *bs = GetDateLocaleString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                    if (bs != nullptr)
                    {
                        return bs;
                    }
                    else
                    {
                        return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                    }
                }
                else
                {
                    return GetDateDefaultString(&m_ymdLcl, &m_tzd, noDateTime, requestContext);
                }
#endif

            case DateStringFormat::GMT:
                EnsureYmdUtc();
                return GetDateGmtString(&m_ymdUtc, requestContext);
        }
    }